

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.hpp
# Opt level: O2

void __thiscall
deqp::gls::VarSpec::VarSpec<tcu::Vector<float,2>>
          (VarSpec *this,string *name_,Vector<float,_2> *minValue_,Vector<float,_2> *maxValue_)

{
  std::__cxx11::string::string((string *)this,(string *)name_);
  set<2>(this,minValue_,maxValue_);
  return;
}

Assistant:

VarSpec (const std::string& name_, const T& minValue_, const T& maxValue_)	: name(name_) { set(minValue_, maxValue_); }